

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs.c
# Opt level: O0

int uv_fs_write(uv_loop_t *loop,uv_fs_t *req,uv_file file,uv_buf_t *bufs,uint nbufs,int64_t off,
               uv_fs_cb cb)

{
  uv_buf_t *puVar1;
  int64_t off_local;
  uint nbufs_local;
  uv_buf_t *bufs_local;
  uv_file file_local;
  uv_fs_t *req_local;
  uv_loop_t *loop_local;
  
  if (req == (uv_fs_t *)0x0) {
    loop_local._4_4_ = -0x16;
  }
  else {
    req->type = UV_FS;
    req->fs_type = UV_FS_WRITE;
    req->result = 0;
    req->ptr = (void *)0x0;
    req->loop = loop;
    req->path = (char *)0x0;
    req->new_path = (char *)0x0;
    req->bufs = (uv_buf_t *)0x0;
    req->cb = cb;
    if ((bufs == (uv_buf_t *)0x0) || (nbufs == 0)) {
      loop_local._4_4_ = -0x16;
    }
    else {
      req->file = file;
      req->nbufs = nbufs;
      req->bufs = req->bufsml;
      if (4 < nbufs) {
        puVar1 = (uv_buf_t *)uv__malloc((ulong)nbufs << 4);
        req->bufs = puVar1;
      }
      if (req->bufs == (uv_buf_t *)0x0) {
        loop_local._4_4_ = -0xc;
      }
      else {
        memcpy(req->bufs,bufs,(ulong)nbufs << 4);
        req->off = off;
        if (cb == (uv_fs_cb)0x0) {
          uv__fs_work(&req->work_req);
          loop_local._4_4_ = (int)req->result;
        }
        else {
          (loop->active_reqs).count = (loop->active_reqs).count + 1;
          uv__work_submit(loop,&req->work_req,UV__WORK_FAST_IO,uv__fs_work,uv__fs_done);
          loop_local._4_4_ = 0;
        }
      }
    }
  }
  return loop_local._4_4_;
}

Assistant:

int uv_fs_write(uv_loop_t* loop,
                uv_fs_t* req,
                uv_file file,
                const uv_buf_t bufs[],
                unsigned int nbufs,
                int64_t off,
                uv_fs_cb cb) {
  INIT(WRITE);

  if (bufs == NULL || nbufs == 0)
    return UV_EINVAL;

  req->file = file;

  req->nbufs = nbufs;
  req->bufs = req->bufsml;
  if (nbufs > ARRAY_SIZE(req->bufsml))
    req->bufs = uv__malloc(nbufs * sizeof(*bufs));

  if (req->bufs == NULL)
    return UV_ENOMEM;

  memcpy(req->bufs, bufs, nbufs * sizeof(*bufs));

  req->off = off;
  POST;
}